

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O0

void node::fill_ln(vector<int,_std::allocator<int>_> *prel_to_ln,
                  vector<int,_std::allocator<int>_> *prer_to_ln,
                  vector<int,_std::allocator<int>_> *prel_to_size,
                  vector<int,_std::allocator<int>_> *prer_to_prel)

{
  const_reference pvVar1;
  reference pvVar2;
  undefined4 local_34;
  undefined4 local_30;
  int i;
  int current_leaf_prer;
  int current_leaf_prel;
  vector<int,_std::allocator<int>_> *prer_to_prel_local;
  vector<int,_std::allocator<int>_> *prel_to_size_local;
  vector<int,_std::allocator<int>_> *prer_to_ln_local;
  vector<int,_std::allocator<int>_> *prel_to_ln_local;
  
  i = -1;
  local_30 = -1;
  local_34 = 0;
  while( true ) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_size,0);
    if (*pvVar1 <= local_34) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_ln,(long)local_34);
    *pvVar2 = i;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_size,(long)local_34);
    if (*pvVar1 == 1) {
      i = local_34;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](prer_to_ln,(long)local_34);
    *pvVar2 = local_30;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](prer_to_prel,(long)local_34);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_size,(long)*pvVar1);
    if (*pvVar1 == 1) {
      local_30 = local_34;
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void fill_ln(std::vector<int>& prel_to_ln,
    std::vector<int>& prer_to_ln,
    const std::vector<int>& prel_to_size,
    const std::vector<int>& prer_to_prel) {
  int current_leaf_prel = -1;
  int current_leaf_prer = -1;
  for(int i = 0; i < prel_to_size[0]; ++i) {
    prel_to_ln[i] = current_leaf_prel;
    if(prel_to_size[i] == 1) {
      current_leaf_prel = i;
    }
    prer_to_ln[i] = current_leaf_prer;
    if(prel_to_size[prer_to_prel[i]] == 1) {
      current_leaf_prer = i;
    }
  }
}